

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.hpp
# Opt level: O3

unique_ptr<TasGrid::GridWavelet,_std::default_delete<TasGrid::GridWavelet>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridWavelet>::read<TasGrid::IO::mode_binary_type>
          (GridReaderVersion5<TasGrid::GridWavelet> *this,AccelerationContext *acc,istream *is)

{
  long lVar1;
  unsigned_long num_entries;
  pointer *__ptr;
  GridWavelet *this_00;
  long lVar2;
  size_t sVar3;
  int v;
  MultiIndexSet local_70;
  vector<double,_std::allocator<double>_> local_48;
  AccelerationContext *local_28;
  
  local_28 = acc;
  Utils::make_unique<TasGrid::GridWavelet,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,&local_28);
  ::std::istream::read((char *)is,(long)&local_70);
  *(int *)(*(long *)this + 0x10) = (int)local_70.num_dimensions;
  ::std::istream::read((char *)is,(long)&local_70);
  num_entries = *(unsigned_long *)this;
  *(int *)(num_entries + 0x14) = (int)local_70.num_dimensions;
  ::std::istream::read((char *)is,(long)&local_70);
  lVar1 = *(long *)this;
  *(int *)(lVar1 + 0xd0) = (int)local_70.num_dimensions;
  RuleWavelet::updateOrder((RuleWavelet *)(lVar1 + 0x90),(int)local_70.num_dimensions);
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_70,is);
    lVar1 = *(long *)this;
    *(int *)(lVar1 + 0x20) = local_70.cache_num_indexes;
    *(size_t *)(lVar1 + 0x18) = local_70.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x28),&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_70,is);
    lVar1 = *(long *)this;
    *(int *)(lVar1 + 0x48) = local_70.cache_num_indexes;
    *(size_t *)(lVar1 + 0x40) = local_70.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x50),&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    sVar3 = (size_t)*(int *)(*(long *)this + 0x14);
    lVar2 = (long)*(int *)(*(long *)this + 0x20);
    IO::readVector<TasGrid::IO::mode_binary_type,double,unsigned_long>
              (&local_48,(IO *)is,(istream *)(lVar2 * sVar3),num_entries);
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    lVar1 = *(long *)this;
    *(size_t *)(lVar1 + 0xd8) = sVar3;
    *(long *)(lVar1 + 0xe0) = lVar2;
    local_70.num_dimensions = sVar3;
    local_70._8_8_ = lVar2;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(lVar1 + 0xe8),
               (vector<double,_std::allocator<double>_> *)&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  this_00 = *(GridWavelet **)this;
  if (0 < (this_00->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_binary_type>((StorageSet *)&local_70,is);
    lVar1 = *(long *)this;
    *(size_t *)(lVar1 + 0x68) = local_70.num_dimensions;
    *(undefined8 *)(lVar1 + 0x70) = local_70._8_8_;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x78),
               (vector<double,_std::allocator<double>_> *)&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    this_00 = *(GridWavelet **)this;
  }
  GridWavelet::buildInterpolationMatrix(this_00);
  return (__uniq_ptr_data<TasGrid::GridWavelet,_std::default_delete<TasGrid::GridWavelet>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridWavelet,_std::default_delete<TasGrid::GridWavelet>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridWavelet> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridWavelet> grid = Utils::make_unique<GridWavelet>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->order = IO::readNumber<iomode, int>(is);
        grid->rule1D.updateOrder(grid->order);

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (std::is_same<iomode, IO::mode_ascii_type>::value){ // backwards compatible: surpluses and needed, or needed and surpluses
            if (IO::readFlag<iomode>(is))
                grid->coefficients = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
            if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
        }else{
            if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
            if (IO::readFlag<iomode>(is))
                grid->coefficients = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
        }

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());
        grid->buildInterpolationMatrix();

        return grid;
    }